

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.hxx
# Opt level: O0

bool compare<double>(double *a,double *b,string *str,double epsilon)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  double epsilon_local;
  string *str_local;
  double *b_local;
  double *a_local;
  
  bVar1 = ABS(*a - *b) < epsilon;
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in ");
    poVar2 = std::operator<<(poVar2,(string *)str);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pvVar3 = (void *)std::ostream::operator<<(&std::cerr,*a);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,*b);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  return bVar1;
}

Assistant:

inline bool compare(const T & a, const T & b, const std::string & str, double epsilon = 1e-12)
{
  if (fabs(a-b) >= epsilon)
  {
    std::cerr << "Error in "<< str << ":" << std::endl;
    std::cerr << a << std::endl << b << std::endl;
    return false;
  }
  return true;
}